

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexBoxFilter::buildKernel
          (PtexBoxFilter *this,PtexSeparableKernel *k,float u,float v,float uw,float vw,Res faceRes)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined4 in_XMM2_Db;
  int iVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float __x;
  undefined1 auVar19 [16];
  anon_union_4_2_f9ecf184 anon_var_0;
  float fVar20;
  undefined1 auVar21 [16];
  float __x_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar18 [16];
  
  auVar16._4_12_ = in_register_000012c4;
  auVar16._0_4_ = vw;
  auVar15._0_8_ = auVar16._0_8_;
  auVar15._8_4_ = in_register_000012c4._0_4_;
  auVar15._12_4_ = in_XMM2_Db;
  auVar22._8_8_ = auVar15._8_8_;
  auVar22._4_4_ = uw;
  auVar22._0_4_ = vw;
  auVar16 = minps(auVar22,_DAT_00500d30);
  auVar12._0_4_ = (float)(0x3f800000 - ((int)((uint)(byte)faceRes.vlog2 << 0x18) >> 1));
  auVar12._4_4_ = (float)(0x3f800000 - ((int)((uint)(ushort)faceRes << 0x18) >> 1));
  auVar12._8_8_ = 0;
  fVar20 = auVar16._4_4_;
  iVar5 = -(uint)(auVar12._0_4_ < auVar16._0_4_);
  iVar6 = -(uint)(auVar12._4_4_ < fVar20);
  auVar19._4_4_ = iVar6;
  auVar19._0_4_ = iVar5;
  auVar19._8_4_ = iVar6;
  auVar19._12_4_ = iVar6;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._4_4_ = iVar5;
  auVar18._0_4_ = iVar5;
  uVar2 = movmskpd((uint)(byte)faceRes.vlog2,auVar18);
  if ((uVar2 & 2) == 0) {
    fVar20 = auVar12._4_4_;
  }
  if ((uVar2 & 1) == 0) {
    auVar16 = auVar12;
  }
  uVar2 = 0x7f - ((uint)fVar20 >> 0x17);
  iVar5 = ((uVar2 & 0xff) - ((uint)auVar16._0_4_ >> 0xf & 0x1ff00)) + 0x7f00;
  k->res = SUB42(iVar5,0);
  fVar11 = (float)(1 << ((byte)uVar2 & 0x1f));
  fVar17 = (float)(1 << ((byte)((uint)iVar5 >> 8) & 0x1f));
  fVar7 = u * fVar11;
  fVar10 = v * fVar17;
  fVar20 = fVar20 * fVar11;
  fVar17 = auVar16._0_4_ * fVar17;
  __x = fVar20 * -0.5 + fVar7;
  fVar7 = fVar20 * 0.5 + fVar7;
  __x_00 = fVar17 * -0.5 + fVar10;
  fVar10 = fVar17 * 0.5 + fVar10;
  fVar20 = floorf(__x);
  fVar11 = ceilf(fVar7);
  fVar17 = floorf(__x_00);
  fVar8 = ceilf(fVar10);
  k->u = (int)fVar20;
  k->v = (int)fVar17;
  iVar6 = (int)fVar11 - (int)fVar20;
  k->uw = iVar6;
  iVar5 = (int)fVar8 - (int)fVar17;
  k->vw = iVar5;
  pfVar1 = k->ku;
  fVar20 = (fVar20 - __x) + 1.0;
  fVar7 = (fVar7 - fVar11) + 1.0;
  if (iVar6 == 1) {
    *pfVar1 = fVar20 + fVar7 + -1.0;
  }
  else {
    *pfVar1 = fVar20;
    auVar15 = _DAT_02dca810;
    auVar12 = _DAT_02dca7f0;
    auVar16 = _DAT_00517f60;
    if (2 < iVar6) {
      lVar3 = (ulong)(iVar6 - 1U) - 2;
      auVar13._8_4_ = (int)lVar3;
      auVar13._0_8_ = lVar3;
      auVar13._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar4 = 0;
      auVar13 = auVar13 ^ _DAT_02dca810;
      do {
        auVar23._8_4_ = (int)uVar4;
        auVar23._0_8_ = uVar4;
        auVar23._12_4_ = (int)(uVar4 >> 0x20);
        auVar22 = (auVar23 | auVar16) ^ auVar15;
        iVar14 = auVar13._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar14 && auVar13._0_4_ < auVar22._0_4_ ||
                    iVar14 < auVar22._4_4_) & 1)) {
          pfVar1[uVar4 + 1] = 1.0;
        }
        if ((auVar22._12_4_ != auVar13._12_4_ || auVar22._8_4_ <= auVar13._8_4_) &&
            auVar22._12_4_ <= auVar13._12_4_) {
          pfVar1[uVar4 + 2] = 1.0;
        }
        auVar22 = (auVar23 | auVar12) ^ auVar15;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar14 && (iVar24 != iVar14 || auVar22._0_4_ <= auVar13._0_4_)) {
          pfVar1[uVar4 + 3] = 1.0;
          pfVar1[uVar4 + 4] = 1.0;
        }
        uVar4 = uVar4 + 4;
      } while ((iVar6 + 1U & 0xfffffffc) != uVar4);
    }
    pfVar1[(int)(iVar6 - 1U)] = fVar7;
  }
  pfVar1 = k->kv;
  fVar7 = (fVar17 - __x_00) + 1.0;
  fVar20 = (fVar10 - fVar8) + 1.0;
  if (iVar5 == 1) {
    *pfVar1 = fVar7 + fVar20 + -1.0;
  }
  else {
    *pfVar1 = fVar7;
    auVar15 = _DAT_02dca810;
    auVar12 = _DAT_02dca7f0;
    auVar16 = _DAT_00517f60;
    if (2 < iVar5) {
      lVar3 = (ulong)(iVar5 - 1U) - 2;
      auVar9._8_4_ = (int)lVar3;
      auVar9._0_8_ = lVar3;
      auVar9._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar4 = 0;
      auVar9 = auVar9 ^ _DAT_02dca810;
      do {
        auVar21._8_4_ = (int)uVar4;
        auVar21._0_8_ = uVar4;
        auVar21._12_4_ = (int)(uVar4 >> 0x20);
        auVar22 = (auVar21 | auVar16) ^ auVar15;
        iVar6 = auVar9._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar6 && auVar9._0_4_ < auVar22._0_4_ || iVar6 < auVar22._4_4_
                    ) & 1)) {
          pfVar1[uVar4 + 1] = 1.0;
        }
        if ((auVar22._12_4_ != auVar9._12_4_ || auVar22._8_4_ <= auVar9._8_4_) &&
            auVar22._12_4_ <= auVar9._12_4_) {
          pfVar1[uVar4 + 2] = 1.0;
        }
        auVar22 = (auVar21 | auVar12) ^ auVar15;
        iVar14 = auVar22._4_4_;
        if (iVar14 <= iVar6 && (iVar14 != iVar6 || auVar22._0_4_ <= auVar9._0_4_)) {
          pfVar1[uVar4 + 3] = 1.0;
          pfVar1[uVar4 + 4] = 1.0;
        }
        uVar4 = uVar4 + 4;
      } while ((iVar5 + 1U & 0xfffffffc) != uVar4);
    }
    pfVar1[(int)(iVar5 - 1U)] = fVar20;
  }
  return;
}

Assistant:

virtual void buildKernel(PtexSeparableKernel& k, float u, float v, float uw, float vw,
                             Res faceRes)
    {
        // clamp filter width to no larger than 1.0
        uw = PtexUtils::min(uw, 1.0f);
        vw = PtexUtils::min(vw, 1.0f);

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(faceRes.ulog2));
        vw = PtexUtils::max(vw, PtexUtils::reciprocalPow2(faceRes.vlog2));

        // compute desired texture res based on filter width
        uint8_t ureslog2 = (uint8_t)PtexUtils::calcResFromWidth(uw);
        uint8_t vreslog2 = (uint8_t)PtexUtils::calcResFromWidth(vw);
        Res res(ureslog2, vreslog2);
        k.res = res;

        // convert from normalized coords to pixel coords
        u = u * (float)k.res.u();
        v = v * (float)k.res.v();
        uw *= (float)k.res.u();
        vw *= (float)k.res.v();

        // find integer pixel extent: [u,v] +/- [uw/2,vw/2]
        // (box is 1 unit wide for a 1 unit filter period)
        float u1 = u - 0.5f*uw, u2 = u + 0.5f*uw;
        float v1 = v - 0.5f*vw, v2 = v + 0.5f*vw;
        float u1floor = PtexUtils::floor(u1), u2ceil = PtexUtils::ceil(u2);
        float v1floor = PtexUtils::floor(v1), v2ceil = PtexUtils::ceil(v2);
        k.u = int(u1floor);
        k.v = int(v1floor);
        k.uw = int(u2ceil)-k.u;
        k.vw = int(v2ceil)-k.v;

        // compute kernel weights along u and v directions
        computeWeights(k.ku, k.uw, 1.0f-(u1-u1floor), 1.0f-(u2ceil-u2));
        computeWeights(k.kv, k.vw, 1.0f-(v1-v1floor), 1.0f-(v2ceil-v2));
    }